

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

void sigfiddle_reattack(t_sigfiddle *x,t_floatarg attacktime,t_floatarg attackthresh)

{
  t_float local_18;
  float local_14;
  t_floatarg attackthresh_local;
  t_floatarg attacktime_local;
  t_sigfiddle *x_local;
  
  local_14 = attacktime;
  if (attacktime < 0.0) {
    local_14 = 0.0;
  }
  local_18 = attackthresh;
  if (attackthresh <= 0.0) {
    local_18 = 1000.0;
  }
  x->x_attacktime = (int)local_14;
  x->x_attackthresh = local_18;
  x->x_attackbins = (int)((x->x_sr * 0.001 * local_14) / (float)x->x_hop);
  if (0x13 < x->x_attackbins) {
    x->x_attackbins = 0x13;
  }
  return;
}

Assistant:

void sigfiddle_reattack(t_sigfiddle *x,
    t_floatarg attacktime, t_floatarg attackthresh)
{
    if (attacktime < 0) attacktime = 0;
    if (attackthresh <= 0) attackthresh = 1000;
    x->x_attacktime = attacktime;
    x->x_attackthresh = attackthresh;
    x->x_attackbins = (x->x_sr * 0.001 * attacktime) / x->x_hop;
    if (x->x_attackbins >= HISTORY) x->x_attackbins = HISTORY - 1;
}